

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O2

dir_tree_t * alloc_dir_tree(char *dir)

{
  size_t sVar1;
  dir_tree_t *pdVar2;
  
  sVar1 = strlen(dir);
  pdVar2 = (dir_tree_t *)malloc(sVar1 + 0x1a);
  if (pdVar2 != (dir_tree_t *)0x0) {
    strcpy((char *)(pdVar2 + 1),dir);
    pdVar2->path_size = sVar1;
    if (dir[sVar1 - 1] != '/') {
      pdVar2->path_size = sVar1 + 1;
      *(undefined2 *)((long)&pdVar2[1].next + sVar1) = 0x2f;
    }
    pdVar2->next = (dir_tree_s *)0x0;
    pdVar2->files = (file_entry_t *)0x0;
  }
  return pdVar2;
}

Assistant:

dir_tree_t *alloc_dir_tree(const char *dir)
{
	dir_tree_t *tree;
	size_t dirlen;

	dirlen = strlen(dir);
	tree = malloc(sizeof(dir_tree_t) + dirlen + 2);
	if (tree != NULL)
	{
		strcpy(tree->path, dir);
		tree->path_size = dirlen;
		if (dir[dirlen - 1] != '/')
		{
			tree->path_size++;
			tree->path[dirlen] = '/';
			tree->path[dirlen + 1] = '\0';
		}
		tree->files = NULL;
		tree->next = NULL;
	}
	return tree;
}